

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O2

int __thiscall
QAccessibleCalendarWidget::indexOfChild(QAccessibleCalendarWidget *this,QAccessibleInterface *child)

{
  int iVar1;
  int iVar2;
  long lVar3;
  QObject *object;
  QAbstractItemView *pQVar4;
  
  iVar2 = -1;
  if (child != (QAccessibleInterface *)0x0) {
    lVar3 = (**(code **)(*(long *)child + 0x18))(child);
    if (lVar3 != 0) {
      iVar1 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x50))(this);
      if (0 < iVar1) {
        object = (QObject *)(**(code **)(*(long *)child + 0x18))(child);
        pQVar4 = QtPrivate::qobject_cast_helper<QAbstractItemView*,QObject>(object);
        if (pQVar4 == (QAbstractItemView *)0x0) {
          iVar2 = 0;
        }
        else {
          iVar2 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x50))(this);
          iVar2 = iVar2 + -1;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int QAccessibleCalendarWidget::indexOfChild(const QAccessibleInterface *child) const
{
    if (!child || !child->object() || childCount() <= 0)
        return -1;
    if (qobject_cast<QAbstractItemView *>(child->object()))
        return childCount() - 1; // FIXME
    return 0;
}